

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_PDU.cpp
# Opt level: O3

void __thiscall KDIS::PDU::IFF_PDU::Encode(IFF_PDU *this,KDataStream *stream)

{
  pointer pKVar1;
  pointer pKVar2;
  
  Header7::Encode(&this->super_Header,stream);
  (*(this->m_EmittingEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_EmittingEntityID,stream);
  (*(this->m_EventID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_EventID,stream);
  (*(this->m_Location).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Location,stream);
  (*(this->m_SystemID).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_SystemID,stream);
  KDataStream::Write(stream,this->m_ui8SystemDesignator);
  KDataStream::Write(stream,this->m_ui8SystemSpecific);
  (*(this->m_FOD).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_FOD,stream);
  pKVar1 = (this->m_vLayers).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pKVar2 = (this->m_vLayers).
                super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::LayerHeader>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pKVar2 != pKVar1; pKVar2 = pKVar2 + 1) {
    (*(pKVar2->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[5])(pKVar2->m_pRef,stream);
  }
  return;
}

Assistant:

void IFF_PDU::Encode( KDataStream & stream ) const
{
    Header::Encode( stream );

    stream << KDIS_STREAM m_EmittingEntityID
           << KDIS_STREAM m_EventID
           << KDIS_STREAM m_Location
           << KDIS_STREAM m_SystemID
           << m_ui8SystemDesignator
		   << m_ui8SystemSpecific
           << KDIS_STREAM m_FOD;

	vector<LyrHdrPtr>::const_iterator citr = m_vLayers.begin();
	vector<LyrHdrPtr>::const_iterator citrEnd = m_vLayers.end();
	for( ; citr != citrEnd; ++citr )
	{
		( *citr )->Encode( stream );
	}
}